

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall QMetaMethodBuilder::setConst(QMetaMethodBuilder *this,bool methodIsConst)

{
  QMetaMethodBuilderPrivate *pQVar1;
  
  pQVar1 = d_func(this);
  if (pQVar1 != (QMetaMethodBuilderPrivate *)0x0) {
    pQVar1->attributes = (uint)methodIsConst << 8 | pQVar1->attributes & 0xfffffeffU;
  }
  return;
}

Assistant:

void QMetaMethodBuilder::setConst(bool methodIsConst)
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (!d)
        return;
    if (methodIsConst)
        d->attributes |= MethodIsConst;
    else
        d->attributes &= ~MethodIsConst;
}